

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

bool __thiscall toml::internal::Parser::parseInlineTable(Parser *this,Value *value)

{
  TokenType TVar1;
  bool bVar2;
  string key;
  Value v;
  Value t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = consumeForKey(this,LBRACE);
  if (bVar2) {
    key.field_2._8_8_ = &key._M_string_length;
    key._M_dataplus._M_p = (pointer)0x0;
    key._M_string_length = 0;
    key.field_2._M_allocated_capacity = 0;
    Value::Value(&t,(Table *)&key);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)&key);
    bVar2 = true;
    while (TVar1 = (this->token_).type_, TVar1 != RBRACE) {
      if (!bVar2) {
        if (TVar1 == COMMA) {
          nextKey(this);
          goto LAB_0016c10c;
        }
        std::__cxx11::string::string
                  ((string *)&key,"inline table didn\'t have \',\' for delimiter?",
                   (allocator *)&local_50);
        addError(this,&key);
LAB_0016c211:
        std::__cxx11::string::~string((string *)&key);
        goto LAB_0016c219;
      }
LAB_0016c10c:
      key._M_string_length = 0;
      key.field_2._M_allocated_capacity = key.field_2._M_allocated_capacity & 0xffffffffffffff00;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      bVar2 = parseKey(this,&key);
      if (!bVar2) goto LAB_0016c211;
      bVar2 = consumeForValue(this,EQUAL);
      if (!bVar2) goto LAB_0016c211;
      v.type_ = NULL_TYPE;
      v.field_1.null_ = (void *)0x0;
      bVar2 = parseValue(this,&v);
      if (!bVar2) {
LAB_0016c1e6:
        Value::~Value(&v);
        goto LAB_0016c211;
      }
      bVar2 = Value::has(&t,&key);
      if (bVar2) {
        std::operator+(&local_50,"inline table has multiple same keys: key=",&key);
        addError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0016c1e6;
      }
      Value::set(&t,&key,&v);
      Value::~Value(&v);
      std::__cxx11::string::~string((string *)&key);
      bVar2 = false;
    }
    bVar2 = consumeForValue(this,RBRACE);
    if (bVar2) {
      Value::operator=(value,&t);
      bVar2 = true;
    }
    else {
LAB_0016c219:
      bVar2 = false;
    }
    Value::~Value(&t);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool Parser::parseInlineTable(Value* value)
{
    // For inline table, next is KEY, so use consumeForKey here.
    if (!consumeForKey(TokenType::LBRACE))
        return false;

    Value t((Table()));
    bool first = true;
    while (true) {
        if (token().type() == TokenType::RBRACE) {
            break;
        }

        if (!first) {
            if (token().type() != TokenType::COMMA) {
                addError("inline table didn't have ',' for delimiter?");
                return false;
            }
            nextKey();
        }
        first = false;

        std::string key;
        if (!parseKey(&key))
            return false;
        if (!consumeForValue(TokenType::EQUAL))
            return false;
        Value v;
        if (!parseValue(&v))
            return false;

        if (t.has(key)) {
            addError("inline table has multiple same keys: key=" + key);
            return false;
        }

        t.set(key, v);
    }

    if (!consumeForValue(TokenType::RBRACE))
        return false;
    *value = std::move(t);
    return true;
}